

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O1

int cmd_ln_free_r(cmd_ln_t *cmdln)

{
  int iVar1;
  gnode_s *pgVar2;
  int iVar3;
  glist_t g;
  ulong uVar4;
  int32 n;
  int32 local_1c;
  
  iVar3 = 0;
  if (cmdln != (cmd_ln_t *)0x0) {
    iVar1 = cmdln->refcount;
    iVar3 = iVar1 + -1;
    cmdln->refcount = iVar3;
    if (iVar1 < 2) {
      if (cmdln->ht != (hash_table_t *)0x0) {
        g = hash_table_tolist(cmdln->ht,&local_1c);
        for (pgVar2 = g; pgVar2 != (glist_t)0x0; pgVar2 = pgVar2->next) {
          cmd_ln_val_free(*(cmd_ln_val_t **)((pgVar2->data).i + 0x10));
        }
        glist_free(g);
        hash_table_free(cmdln->ht);
        cmdln->ht = (hash_table_t *)0x0;
      }
      if (cmdln->f_argv != (char **)0x0) {
        if (cmdln->f_argc != 0) {
          uVar4 = 0;
          do {
            ckd_free(cmdln->f_argv[uVar4]);
            uVar4 = uVar4 + 1;
          } while (uVar4 < cmdln->f_argc);
        }
        ckd_free(cmdln->f_argv);
        cmdln->f_argv = (char **)0x0;
        cmdln->f_argc = 0;
      }
      ckd_free(cmdln);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
cmd_ln_free_r(cmd_ln_t *cmdln)
{
    if (cmdln == NULL)
        return 0;
    if (--cmdln->refcount > 0)
        return cmdln->refcount;

    if (cmdln->ht) {
        glist_t entries;
        gnode_t *gn;
        int32 n;

        entries = hash_table_tolist(cmdln->ht, &n);
        for (gn = entries; gn; gn = gnode_next(gn)) {
            hash_entry_t *e = (hash_entry_t *)gnode_ptr(gn);
            cmd_ln_val_free((cmd_ln_val_t *)e->val);
        }
        glist_free(entries);
        hash_table_free(cmdln->ht);
        cmdln->ht = NULL;
    }

    if (cmdln->f_argv) {
        int32 i;
        for (i = 0; i < cmdln->f_argc; ++i) {
            ckd_free(cmdln->f_argv[i]);
        }
        ckd_free(cmdln->f_argv);
        cmdln->f_argv = NULL;
        cmdln->f_argc = 0;
    }
    ckd_free(cmdln);
    return 0;
}